

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O2

QColor QStyleHelper::backgroundColor(QPalette *pal,QWidget *widget)

{
  long lVar1;
  QScrollBar *pQVar2;
  QAbstractScrollArea *pQVar3;
  QColor *pQVar4;
  
  pQVar2 = QtPrivate::qobject_cast_helper<QScrollBar_const*,QObject_const>(&widget->super_QObject);
  if ((pQVar2 != (QScrollBar *)0x0) &&
     (lVar1 = *(long *)(*(long *)&widget->field_0x8 + 0x10), lVar1 != 0)) {
    pQVar3 = QtPrivate::qobject_cast_helper<QAbstractScrollArea_const*,QObject>
                       (*(QObject **)(*(long *)(lVar1 + 8) + 0x10));
    if (pQVar3 != (QAbstractScrollArea *)0x0) {
      pal = QWidget::palette(*(QWidget **)
                              (*(long *)(*(long *)(*(long *)&widget->field_0x8 + 0x10) + 8) + 0x10))
      ;
    }
  }
  pQVar4 = QPalette::color(pal,Base);
  return *pQVar4;
}

Assistant:

QColor backgroundColor(const QPalette &pal, const QWidget* widget)
{
#if QT_CONFIG(scrollarea)
    if (qobject_cast<const QScrollBar *>(widget) && widget->parent() &&
            qobject_cast<const QAbstractScrollArea *>(widget->parent()->parent()))
        return widget->parentWidget()->parentWidget()->palette().color(QPalette::Base);
#else
    Q_UNUSED(widget);
#endif
    return pal.color(QPalette::Base);
}